

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPrePartialsStates
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          int *states2,float *matrices2,int startPattern,int endPattern)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float *pfVar10;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  float *pfVar19;
  ulong uVar20;
  float *pfVar21;
  float *pfVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  float *local_c0;
  float *local_b0;
  
  uVar3 = this->kStateCount;
  iVar4 = this->kPartialsSize;
  for (lVar12 = 0; (long)iVar4 * 4 != lVar12; lVar12 = lVar12 + 4) {
    *(undefined4 *)((long)destP + lVar12) = 0;
  }
  iVar4 = this->kPartialsPaddedStateCount;
  iVar5 = this->kPatternCount;
  lVar12 = (long)(int)(uVar3 + 1);
  uVar6 = this->kCategoryCount;
  iVar7 = this->kMatrixSize;
  iVar16 = 0;
  local_b0 = matrices1 + 3;
  local_c0 = matrices1;
  for (uVar14 = 0; uVar14 != (~((int)uVar6 >> 0x1f) & uVar6); uVar14 = uVar14 + 1) {
    iVar15 = (iVar5 * (int)uVar14 + startPattern) * iVar4;
    pfVar13 = partials1 + iVar15;
    pfVar22 = destP + iVar15;
    for (lVar18 = (long)startPattern; lVar18 < endPattern; lVar18 = lVar18 + 1) {
      iVar15 = states2[lVar18];
      lVar17 = (long)iVar16;
      pfVar19 = local_c0;
      pfVar21 = local_b0;
      for (uVar20 = 0; uVar20 != (~((int)uVar3 >> 0x1f) & uVar3); uVar20 = uVar20 + 1) {
        lVar23 = 0;
        fVar8 = matrices2[iVar15 + lVar17] * pfVar13[uVar20];
        pfVar10 = pfVar19;
        pfVar11 = pfVar22;
        while (lVar23 < (int)uVar3 / 4 << 2) {
          pfVar10 = pfVar10 + 4;
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)pfVar21[lVar23 + -3]),ZEXT416((uint)fVar8),
                                   ZEXT416((uint)*pfVar11));
          *pfVar11 = auVar9._0_4_;
          auVar25 = ZEXT416((uint)fVar8);
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)pfVar21[lVar23 + -2]),auVar25,
                                   ZEXT416((uint)pfVar11[1]));
          pfVar11[1] = auVar9._0_4_;
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)pfVar21[lVar23 + -1]),auVar25,
                                   ZEXT416((uint)pfVar11[2]));
          pfVar11[2] = auVar9._0_4_;
          pfVar1 = pfVar21 + lVar23;
          lVar23 = lVar23 + 4;
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)*pfVar1),auVar25,ZEXT416((uint)pfVar11[3]));
          pfVar11[3] = auVar9._0_4_;
          pfVar11 = pfVar11 + 4;
        }
        for (lVar24 = 0; lVar23 + lVar24 < (long)(int)uVar3; lVar24 = lVar24 + 1) {
          fVar2 = *pfVar10;
          pfVar10 = pfVar10 + 1;
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar8),
                                   ZEXT416((uint)pfVar11[lVar24]));
          pfVar11[lVar24] = auVar9._0_4_;
        }
        lVar17 = lVar17 + lVar12;
        pfVar21 = pfVar21 + lVar12;
        pfVar19 = pfVar19 + lVar12;
      }
      pfVar22 = pfVar22 + iVar4;
      pfVar13 = pfVar13 + iVar4;
    }
    iVar16 = iVar16 + iVar7;
    local_b0 = local_b0 + iVar7;
    local_c0 = local_c0 + iVar7;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                              const REALTYPE* partials1,
                                                              const REALTYPE* matrices1,
                                                              const int* states2,
                                                              const REALTYPE* matrices2,
                                                              int startPattern,
                                                              int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];

        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state2 = states2[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;

                tmpdestPtr = destPtr;
                const REALTYPE  MjPj = matrices2[w + state2] * partials1Ptr[i];

                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }

                w += matrixIncr;
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
        }
    }

}